

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O2

void decode_mt_init(AV1Decoder *pbi)

{
  char *pcVar1;
  byte bVar2;
  uint uVar3;
  ThreadData *thread_data;
  AVxWorker *pAVar4;
  AVxWorkerInterface *pAVar5;
  AVxWorker *pAVar6;
  DecWorkerData *pDVar7;
  void *__s;
  long lVar8;
  long lVar9;
  int iVar10;
  
  pAVar5 = aom_get_worker_interface();
  if (pbi->num_workers == 0) {
    uVar3 = pbi->max_threads;
    pAVar6 = (AVxWorker *)aom_malloc((long)(int)uVar3 * 0x38);
    pbi->tile_workers = pAVar6;
    if (pAVar6 == (AVxWorker *)0x0) {
      aom_internal_error((pbi->common).error,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate pbi->tile_workers");
    }
    pDVar7 = (DecWorkerData *)aom_calloc((long)(int)uVar3,0x1b0);
    pbi->thread_data = pDVar7;
    if (pDVar7 == (DecWorkerData *)0x0) {
      aom_internal_error((pbi->common).error,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate pbi->thread_data");
    }
    if ((int)uVar3 < 1) {
      uVar3 = 0;
    }
    lVar8 = 0;
    for (lVar9 = 0; (ulong)uVar3 * 0x38 != lVar9; lVar9 = lVar9 + 0x38) {
      pAVar4 = pbi->tile_workers;
      pDVar7 = pbi->thread_data;
      pAVar6 = (AVxWorker *)((long)&pAVar4->impl_ + lVar9);
      (*pAVar5->init)(pAVar6);
      *(char **)((long)&pAVar4->thread_name + lVar9) = "aom tile worker";
      if (lVar8 == 0) {
        pbi->num_workers = pbi->num_workers + 1;
        pDVar7->td = &pbi->td;
      }
      else {
        iVar10 = (*pAVar5->reset)(pAVar6);
        if (iVar10 == 0) {
          aom_internal_error(&pbi->error,AOM_CODEC_ERROR,"Tile decoder thread creation failed");
        }
        pbi->num_workers = pbi->num_workers + 1;
        __s = aom_memalign(0x20,0x3ebe0);
        *(void **)((pDVar7->error_info).detail + lVar8 + -0x18) = __s;
        if (__s == (void *)0x0) {
          aom_internal_error((pbi->common).error,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate thread_data->td");
          __s = *(void **)((pDVar7->error_info).detail + lVar8 + -0x18);
        }
        memset(__s,0,0x3ebe0);
      }
      pcVar1 = (pDVar7->error_info).detail + lVar8 + -8;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      *(undefined4 *)((long)(pDVar7->error_info).jmp[0].__jmpbuf + lVar8 + -8) = 0;
      lVar8 = lVar8 + 0x1b0;
    }
  }
  bVar2 = ((pbi->common).seq_params)->use_highbitdepth;
  iVar10 = 0x11040 << (bVar2 & 0x1f);
  lVar9 = 0x1b0;
  for (lVar8 = 1; lVar8 < pbi->max_threads; lVar8 = lVar8 + 1) {
    pDVar7 = pbi->thread_data;
    thread_data = *(ThreadData **)((pDVar7->error_info).detail + lVar9 + -0x18);
    if (thread_data->mc_buf_size != iVar10) {
      av1_free_mc_tmp_buf(thread_data);
      allocate_mc_tmp_buf(&pbi->common,*(ThreadData **)((pDVar7->error_info).detail + lVar9 + -0x18)
                          ,iVar10,(uint)bVar2);
    }
    lVar9 = lVar9 + 0x1b0;
  }
  return;
}

Assistant:

static inline void decode_mt_init(AV1Decoder *pbi) {
  AV1_COMMON *const cm = &pbi->common;
  const AVxWorkerInterface *const winterface = aom_get_worker_interface();
  int worker_idx;

  // Create workers and thread_data
  if (pbi->num_workers == 0) {
    const int num_threads = pbi->max_threads;
    CHECK_MEM_ERROR(cm, pbi->tile_workers,
                    aom_malloc(num_threads * sizeof(*pbi->tile_workers)));
    CHECK_MEM_ERROR(cm, pbi->thread_data,
                    aom_calloc(num_threads, sizeof(*pbi->thread_data)));

    for (worker_idx = 0; worker_idx < num_threads; ++worker_idx) {
      AVxWorker *const worker = &pbi->tile_workers[worker_idx];
      DecWorkerData *const thread_data = pbi->thread_data + worker_idx;

      winterface->init(worker);
      worker->thread_name = "aom tile worker";
      if (worker_idx != 0 && !winterface->reset(worker)) {
        aom_internal_error(&pbi->error, AOM_CODEC_ERROR,
                           "Tile decoder thread creation failed");
      }
      ++pbi->num_workers;

      if (worker_idx != 0) {
        // Allocate thread data.
        CHECK_MEM_ERROR(cm, thread_data->td,
                        aom_memalign(32, sizeof(*thread_data->td)));
        av1_zero(*thread_data->td);
      } else {
        // Main thread acts as a worker and uses the thread data in pbi
        thread_data->td = &pbi->td;
      }
      thread_data->error_info.error_code = AOM_CODEC_OK;
      thread_data->error_info.setjmp = 0;
    }
  }
  const int use_highbd = cm->seq_params->use_highbitdepth;
  const int buf_size = MC_TEMP_BUF_PELS << use_highbd;
  for (worker_idx = 1; worker_idx < pbi->max_threads; ++worker_idx) {
    DecWorkerData *const thread_data = pbi->thread_data + worker_idx;
    if (thread_data->td->mc_buf_size != buf_size) {
      av1_free_mc_tmp_buf(thread_data->td);
      allocate_mc_tmp_buf(cm, thread_data->td, buf_size, use_highbd);
    }
  }
}